

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::uniformScaling(Matrix4f *__return_storage_ptr__,float s)

{
  float s_local;
  
  Matrix4f(__return_storage_ptr__,s,0.0,0.0,0.0,0.0,s,0.0,0.0,0.0,0.0,s,0.0,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::uniformScaling( float s )
{
	return Matrix4f
	(
		s, 0, 0, 0,
		0, s, 0, 0,
		0, 0, s, 0,
		0, 0, 0, 1
	);
}